

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  string *psVar2;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  MessageLite *pMVar3;
  size_type sVar4;
  undefined8 uVar5;
  pointer pcVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  anon_enum_32 local_3c;
  anon_enum_32 local_38 [4];
  
  pVar7 = Insert(this,number);
  pEVar1 = pVar7.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_38[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
    local_3c = REPEATED_FIELD;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (local_38,&local_3c,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
    if (psVar2 == (string *)0x0) {
      local_38[0] = anon_unknown_58::cpp_type(pEVar1->type);
      local_3c = 10;
      psVar2 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (local_38,&local_3c,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (psVar2 == (string *)0x0) {
        this_00 = pEVar1->field_0;
        goto LAB_0013149a;
      }
    }
    pcVar6 = (psVar2->_M_dataplus)._M_p;
    sVar4 = psVar2->_M_string_length;
    uVar5 = 0x350;
  }
  else {
    pEVar1->type = type;
    local_38[0] = anon_unknown_58::cpp_type(type);
    local_3c = 10;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_38,&local_3c,
                        "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (psVar2 == (string *)0x0) {
      pEVar1->is_repeated = true;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      this_00 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                Arena::
                CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          (this->arena_);
      pEVar1->field_0 = this_00;
LAB_0013149a:
      pMVar3 = RepeatedPtrFieldBase::AddMessage((RepeatedPtrFieldBase *)this_00,prototype);
      return pMVar3;
    }
    pcVar6 = (psVar2->_M_dataplus)._M_p;
    sVar4 = psVar2->_M_string_length;
    uVar5 = 0x34a;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,uVar5,sVar4,pcVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38);
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}